

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O2

Read<signed_char>
Omega_h::inertia::anon_unknown_0::mark_bisection_internal
          (CommPtr *comm,Reals *coords,Reals *masses,Real tolerance,Vector<3> axis,Vector<3> center,
          Real total_mass)

{
  Vector<3> axis_00;
  bool bVar1;
  Write<double> *in_RCX;
  void *extraout_RDX;
  uint uVar2;
  Read<signed_char> RVar3;
  Vector<3> axis2;
  Reals dists;
  double local_f8 [3];
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *local_e0;
  Write<double> *local_d8;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_d0;
  Write<double> local_c0;
  Write<double> local_b0;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_a0;
  Write<double> local_90;
  Write<double> local_80;
  Write<double> local_70;
  Write<double> local_60;
  Write<double> local_50;
  Write<double> local_40;
  
  local_d8 = &masses->write_;
  Write<double>::Write(&local_50,&masses->write_);
  get_distances((Reals *)&local_90,center,axis);
  Write<double>::~Write(&local_50);
  (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,(__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)coords);
  Write<double>::Write(&local_b0,&local_90);
  Write<double>::Write(&local_c0,in_RCX);
  local_e0 = (__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)coords;
  bVar1 = mark_axis_bisection((CommPtr *)&local_a0,(Reals *)&local_b0,(Reals *)&local_c0,total_mass,
                              tolerance,(Read<signed_char> *)comm);
  Write<double>::~Write(&local_c0);
  Write<double>::~Write(&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  if (!bVar1) {
    uVar2 = 0;
    do {
      if (uVar2 == 6) {
        std::operator<<((ostream *)&std::cerr,"Omega_h WARNING: no good inertial bisection\n");
        break;
      }
      local_f8[2] = axis.super_Few<double,_3>.array_[2];
      local_f8[0] = axis.super_Few<double,_3>.array_[0];
      local_f8[1] = axis.super_Few<double,_3>.array_[1];
      local_f8[uVar2 >> 1] =
           *(double *)(&DAT_0037e310 + (ulong)((uVar2 & 1) == 0) * 8) + local_f8[uVar2 >> 1];
      Write<double>::Write(&local_60,local_d8);
      axis_00.super_Few<double,_3>.array_[1] = local_f8[1];
      axis_00.super_Few<double,_3>.array_[0] = local_f8[0];
      axis_00.super_Few<double,_3>.array_[2] = local_f8[2];
      get_distances((Reals *)&local_40,center,axis_00);
      Write<double>::operator=(&local_90,(Write<signed_char> *)&local_40);
      Write<double>::~Write(&local_40);
      Write<double>::~Write(&local_60);
      std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_d0,local_e0)
      ;
      Write<double>::Write(&local_70,&local_90);
      Write<double>::Write(&local_80,in_RCX);
      bVar1 = mark_axis_bisection((CommPtr *)&local_d0,(Reals *)&local_70,(Reals *)&local_80,
                                  total_mass,tolerance,(Read<signed_char> *)comm);
      Write<double>::~Write(&local_80);
      Write<double>::~Write(&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
      uVar2 = uVar2 + 1;
    } while (!bVar1);
  }
  Write<double>::~Write(&local_90);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)comm;
  return (Read<signed_char>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_bisection_internal(CommPtr comm, Reals coords, Reals masses,
    Real tolerance, Vector<3> axis, Vector<3> center, Real total_mass) {
  auto dists = get_distances(coords, center, axis);
  Read<I8> marked;
  if (mark_axis_bisection(comm, dists, masses, total_mass, tolerance, marked)) {
    return marked;
  }
  // if we couldn't find a decent cutting plane, this may be a highly
  // structured mesh with many points coincident on the cutting plane.
  // perturb the axis vector to escape this scenario
  for (Int i = 0; i < 3 * 2; ++i) {
    auto axis2 = axis;
    axis2[i / 2] += (i % 2) ? 1e-3 : -1e-3;
    dists = get_distances(coords, center, axis2);
    if (mark_axis_bisection(
            comm, dists, masses, total_mass, tolerance, marked)) {
      return marked;
    }
  }
  // even perturbation of the axis could not find a good
  // cutting plane. warn the user of this failure, but continue
  // with the axis that we have, because the cutting plane
  // is still the best we could find.
  // (to date I have not seen this happen, even with > 1 billion elements)
  std::cerr << "Omega_h WARNING: no good inertial bisection\n";
  return marked;
}